

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_dss_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  DSA *dsactx;
  int iVar1;
  uchar *puVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  EVP_MD_CTX *ctx;
  uchar hash [20];
  
  dsactx = (DSA *)*abstract;
  puVar2 = (uchar *)_libssh2_calloc(session,0x28);
  *signature = puVar2;
  if (puVar2 == (uchar *)0x0) {
    iVar4 = -1;
  }
  else {
    *signature_len = 0x28;
    _libssh2_sha1_init(&ctx);
    uVar3 = 0;
    uVar5 = (ulong)(uint)veccount;
    if (veccount < 1) {
      uVar5 = uVar3;
    }
    for (; uVar5 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
      EVP_DigestUpdate((EVP_MD_CTX *)ctx,*(void **)((long)&datavec->iov_base + uVar3),
                       *(size_t *)((long)&datavec->iov_len + uVar3));
    }
    iVar4 = 0;
    EVP_DigestFinal((EVP_MD_CTX *)ctx,hash,(uint *)0x0);
    EVP_MD_CTX_free(ctx);
    iVar1 = _libssh2_dsa_sha1_sign(dsactx,hash,0x14,*signature);
    if (iVar1 != 0) {
      (*session->free)(*signature,&session->abstract);
      iVar4 = -1;
    }
  }
  return iVar4;
}

Assistant:

static int
hostkey_method_ssh_dss_signv(LIBSSH2_SESSION * session,
                             unsigned char **signature,
                             size_t *signature_len,
                             int veccount,
                             const struct iovec datavec[],
                             void **abstract)
{
    libssh2_dsa_ctx *dsactx = (libssh2_dsa_ctx *) (*abstract);
    unsigned char hash[SHA_DIGEST_LENGTH];
    libssh2_sha1_ctx ctx;
    int i;

    *signature = LIBSSH2_CALLOC(session, 2 * SHA_DIGEST_LENGTH);
    if (!*signature) {
        return -1;
    }

    *signature_len = 2 * SHA_DIGEST_LENGTH;

    libssh2_sha1_init(&ctx);
    for(i = 0; i < veccount; i++) {
        libssh2_sha1_update(ctx, datavec[i].iov_base, datavec[i].iov_len);
    }
    libssh2_sha1_final(ctx, hash);

    if (_libssh2_dsa_sha1_sign(dsactx, hash, SHA_DIGEST_LENGTH, *signature)) {
        LIBSSH2_FREE(session, *signature);
        return -1;
    }

    return 0;
}